

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall
capnp::_::BuilderArena::BuilderArena
          (BuilderArena *this,MessageBuilder *message,
          ArrayPtr<capnp::MessageBuilder::SegmentInit> segments)

{
  int value;
  SegmentWordCount size;
  SegmentWordCount wordsUsed;
  SegmentInit *pSVar1;
  word *ptr;
  size_t sVar2;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *this_00;
  SegmentBuilder *pSVar3;
  Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> *pVVar4;
  Vector<kj::ArrayPtr<const_capnp::word>_> *pVVar5;
  ArrayPtr<const_capnp::word> AVar6;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> AVar7;
  MultiSegmentState local_170;
  Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> local_130;
  Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>_> local_120;
  undefined1 local_110 [8];
  Vector<kj::ArrayPtr<const_capnp::word>_> forOutput;
  ReadLimiter *local_e8;
  ArrayPtr<const_capnp::word> local_e0;
  SegmentWordCount local_cc;
  word *local_c8;
  Id<unsigned_int,_capnp::_::Segment> local_bc;
  BuilderArena *local_b8;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> local_b0;
  SegmentInit *local_a0;
  SegmentInit *segment;
  SegmentInit *__end3;
  SegmentInit *__begin3;
  size_t local_80;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> *local_78;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> *__range3;
  undefined1 local_68 [4];
  uint i;
  Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> builders;
  SegmentId local_38 [4];
  MessageBuilder *local_28;
  MessageBuilder *message_local;
  BuilderArena *this_local;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> segments_local;
  
  segments_local.ptr = (SegmentInit *)segments.size_;
  this_local = (BuilderArena *)segments.ptr;
  local_28 = message;
  message_local = (MessageBuilder *)this;
  Arena::Arena(&this->super_Arena);
  (this->super_Arena)._vptr_Arena = (_func_int **)&PTR__BuilderArena_004c6bf0;
  this->message = local_28;
  ReadLimiter::ReadLimiter(&this->dummyLimiter);
  LocalCapTable::LocalCapTable(&this->localCapTable);
  kj::Id<unsigned_int,_capnp::_::Segment>::Id(local_38,0);
  pSVar1 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::operator[]
                     ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local,0);
  ptr = kj::ArrayPtr<capnp::word>::begin(&pSVar1->space);
  pSVar1 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::operator[]
                     ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local,0);
  AVar6 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)pSVar1);
  builders.builder.disposer = (ArrayDisposer *)AVar6.ptr;
  size = verifySegment(AVar6);
  pSVar1 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::operator[]
                     ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local,0);
  wordsUsed = verifySegmentSize(pSVar1->wordsUsed);
  SegmentBuilder::SegmentBuilder
            (&this->segment0,this,local_38[0],ptr,size,&this->dummyLimiter,wordsUsed);
  kj::ArrayPtr<const_capnp::word>::ArrayPtr(&this->segment0ForOutput);
  kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>_>::Maybe
            (&this->moreSegments);
  this->segmentWithSpace = (SegmentBuilder *)0x0;
  sVar2 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::size
                    ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local);
  if (sVar2 < 2) {
    this->segmentWithSpace = &this->segment0;
  }
  else {
    sVar2 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::size
                      ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local);
    kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::Vector
              ((Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> *)local_68,sVar2 - 1);
    __range3._4_4_ = 1;
    sVar2 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::size
                      ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local);
    AVar7 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::slice
                      ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local,1,sVar2);
    local_80 = AVar7.size_;
    __begin3 = AVar7.ptr;
    local_78 = (ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&__begin3;
    __end3 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::begin(local_78);
    segment = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::end(local_78);
    for (; value = __range3._4_4_, __end3 != segment; __end3 = __end3 + 1) {
      local_a0 = __end3;
      __range3._4_4_ = __range3._4_4_ + 1;
      local_b8 = this;
      kj::Id<unsigned_int,_capnp::_::Segment>::Id(&local_bc,value);
      local_c8 = kj::ArrayPtr<capnp::word>::begin(&local_a0->space);
      AVar6 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)local_a0);
      local_e0 = AVar6;
      local_cc = verifySegment(AVar6);
      local_e8 = &this->dummyLimiter;
      forOutput.builder.disposer._4_4_ = verifySegmentSize(local_a0->wordsUsed);
      kj::
      heap<capnp::_::SegmentBuilder,capnp::_::BuilderArena*,kj::Id<unsigned_int,capnp::_::Segment>,capnp::word*,unsigned_int,capnp::_::ReadLimiter*,unsigned_int>
                ((kj *)&local_b0,&local_b8,&local_bc,&local_c8,&local_cc,&local_e8,
                 (uint *)((long)&forOutput.builder.disposer + 4));
      kj::Vector<kj::Own<capnp::_::SegmentBuilder,decltype(nullptr)>>::
      add<kj::Own<capnp::_::SegmentBuilder,decltype(nullptr)>>
                ((Vector<kj::Own<capnp::_::SegmentBuilder,decltype(nullptr)>> *)local_68,&local_b0);
      kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>::~Own(&local_b0);
    }
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::Vector
              ((Vector<kj::ArrayPtr<const_capnp::word>_> *)local_110);
    sVar2 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::size
                      ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local);
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::resize
              ((Vector<kj::ArrayPtr<const_capnp::word>_> *)local_110,sVar2);
    this_00 = kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::back
                        ((Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> *)local_68);
    pSVar3 = kj::Own::operator_cast_to_SegmentBuilder_((Own *)this_00);
    this->segmentWithSpace = pSVar3;
    pVVar4 = kj::mv<kj::Vector<kj::Own<capnp::_::SegmentBuilder,decltype(nullptr)>>>
                       ((Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> *)local_68);
    kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::Vector
              (&local_170.builders,pVVar4);
    pVVar5 = kj::mv<kj::Vector<kj::ArrayPtr<capnp::word_const>>>
                       ((Vector<kj::ArrayPtr<const_capnp::word>_> *)local_110);
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::Vector(&local_170.forOutput,pVVar5);
    kj::heap<capnp::_::BuilderArena::MultiSegmentState>((kj *)&local_130,&local_170);
    kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>_>::Maybe
              (&local_120,&local_130);
    kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>_>::operator=
              (&this->moreSegments,&local_120);
    kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>_>::~Maybe
              (&local_120);
    kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>::~Own(&local_130);
    MultiSegmentState::~MultiSegmentState(&local_170);
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::~Vector
              ((Vector<kj::ArrayPtr<const_capnp::word>_> *)local_110);
    kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::~Vector
              ((Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> *)local_68);
  }
  return;
}

Assistant:

BuilderArena::BuilderArena(MessageBuilder* message,
                           kj::ArrayPtr<MessageBuilder::SegmentInit> segments)
    : message(message),
      segment0(this, SegmentId(0), segments[0].space.begin(),
               verifySegment(segments[0].space),
               &this->dummyLimiter, verifySegmentSize(segments[0].wordsUsed)) {
  if (segments.size() > 1) {
    kj::Vector<kj::Own<SegmentBuilder>> builders(segments.size() - 1);

    uint i = 1;
    for (auto& segment: segments.slice(1, segments.size())) {
      builders.add(kj::heap<SegmentBuilder>(
          this, SegmentId(i++), segment.space.begin(), verifySegment(segment.space),
          &this->dummyLimiter, verifySegmentSize(segment.wordsUsed)));
    }

    kj::Vector<kj::ArrayPtr<const word>> forOutput;
    forOutput.resize(segments.size());

    segmentWithSpace = builders.back();

    this->moreSegments = kj::heap<MultiSegmentState>(
        MultiSegmentState { kj::mv(builders), kj::mv(forOutput) });

  } else {
    segmentWithSpace = &segment0;
  }
}